

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::internal::PrintfFormatter<char>::format
          (PrintfFormatter<char> *this,BasicWriter<char> *writer,BasicCStringRef<char> format_str)

{
  char *pcVar1;
  CStringRef message;
  bool bVar2;
  Type_conflict TVar3;
  undefined8 uVar4;
  char **ppcVar5;
  BasicWriter<char> *in_RDI;
  Arg arg;
  uint arg_index;
  FormatSpec spec;
  char c;
  char *s;
  char *start;
  BasicWriter<char> *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  wchar_t in_stack_fffffffffffffe84;
  undefined8 in_stack_fffffffffffffe88;
  FormatSpec *in_stack_fffffffffffffe90;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  char **in_stack_fffffffffffffea0;
  FormatterBase *in_stack_fffffffffffffeb0;
  FormatSpec *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  uint in_stack_fffffffffffffec4;
  Arg *in_stack_fffffffffffffec8;
  ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void> *in_stack_fffffffffffffed0
  ;
  BasicCStringRef<char> local_128;
  ArgConverter<void> local_120;
  ArgConverter<long> local_110;
  ArgConverter<unsigned_long> local_100;
  ArgConverter<long> local_f0;
  ArgConverter<long> local_e0;
  ArgConverter<long_long> local_d0;
  ArgConverter<short> local_c0;
  ArgConverter<signed_char> local_b0;
  Arg local_98 [2];
  uint local_48;
  FormatSpec local_44;
  char local_29;
  char **local_28;
  char **local_20;
  BasicCStringRef<char> local_8;
  
  local_20 = (char **)BasicCStringRef<char>::c_str(&local_8);
  local_28 = local_20;
  while( true ) {
    while( true ) {
      do {
        if (*(char *)local_28 == '\0') {
          FormatterBase::write<char>
                    (in_stack_fffffffffffffeb0,in_RDI,(char *)in_stack_fffffffffffffea0,
                     (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
          return;
        }
        ppcVar5 = (char **)((long)local_28 + 1);
        local_29 = *(char *)local_28;
        local_28 = ppcVar5;
      } while (local_29 != '%');
      if (*(char *)ppcVar5 != '%') break;
      FormatterBase::write<char>
                (in_stack_fffffffffffffeb0,in_RDI,(char *)in_stack_fffffffffffffea0,
                 (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
      local_20 = (char **)((long)local_28 + 1);
      local_28 = local_20;
    }
    FormatterBase::write<char>
              (in_stack_fffffffffffffeb0,in_RDI,(char *)in_stack_fffffffffffffea0,
               (char *)CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    FormatSpec::FormatSpec
              (in_stack_fffffffffffffe90,(uint)((ulong)in_stack_fffffffffffffe88 >> 0x20),
               (char)((ulong)in_stack_fffffffffffffe88 >> 0x18),in_stack_fffffffffffffe84);
    local_44.super_AlignSpec.align_ = ALIGN_RIGHT;
    local_48 = parse_header((PrintfFormatter<char> *)in_stack_fffffffffffffec8,
                            (char **)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                            in_stack_fffffffffffffeb8);
    ppcVar5 = local_28;
    if (*(char *)local_28 == '.') {
      ppcVar5 = (char **)((long)local_28 + 1);
      if ((*(char *)ppcVar5 < '0') || ('9' < *(char *)ppcVar5)) {
        if (*(char *)ppcVar5 == '*') {
          in_stack_fffffffffffffea0 = (char **)((long)local_28 + 2);
          local_28 = in_stack_fffffffffffffea0;
          std::numeric_limits<unsigned_int>::max();
          get_arg((PrintfFormatter<char> *)in_stack_fffffffffffffed0,
                  (char *)in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
          local_44.precision_ =
               ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int>::visit
                         ((ArgVisitor<fmt::(anonymous_namespace)::PrecisionHandler,_int> *)
                          in_stack_fffffffffffffec8,
                          (Arg *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          ppcVar5 = local_28;
        }
      }
      else {
        local_28 = ppcVar5;
        local_44.precision_ = parse_nonnegative_int<char>(in_stack_fffffffffffffea0);
        ppcVar5 = local_28;
      }
    }
    local_28 = ppcVar5;
    get_arg((PrintfFormatter<char> *)in_stack_fffffffffffffed0,(char *)in_stack_fffffffffffffec8,
            in_stack_fffffffffffffec4);
    bVar2 = FormatSpec::flag(&local_44,8);
    in_stack_fffffffffffffe9f = false;
    if (bVar2) {
      in_stack_fffffffffffffe9f =
           ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool>::visit
                     ((ArgVisitor<fmt::(anonymous_namespace)::IsZeroInt,_bool> *)
                      in_stack_fffffffffffffec8,
                      (Arg *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    }
    if ((bool)in_stack_fffffffffffffe9f != false) {
      TVar3 = to_unsigned<int>(8);
      local_44.flags_ = (TVar3 ^ 0xffffffff) & local_44.flags_;
    }
    if (local_44.super_AlignSpec.super_WidthSpec.fill_ == L'0') {
      if ((int)local_98[0].type < 10) {
        local_44.super_AlignSpec.align_ = ALIGN_NUMERIC;
      }
      else {
        local_44.super_AlignSpec.super_WidthSpec.fill_ = L' ';
      }
    }
    ppcVar5 = (char **)((long)local_28 + 1);
    in_stack_fffffffffffffe90 = (FormatSpec *)(ulong)((int)*(char *)local_28 - 0x4c);
    switch(in_stack_fffffffffffffe90) {
    case (FormatSpec *)0x0:
      local_28 = ppcVar5;
      break;
    default:
      anon_unknown_1::ArgConverter<void>::ArgConverter(&local_120,local_98,(int)*(char *)local_28);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (FormatSpec *)0x1c:
      if (*(char *)ppcVar5 == 'h') {
        pcVar1 = (char *)((long)local_28 + 2);
        local_28 = (char **)((long)local_28 + 2);
        anon_unknown_1::ArgConverter<signed_char>::ArgConverter(&local_b0,local_98,(int)*pcVar1);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<signed_char>,_void>::visit
                  (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      }
      else {
        local_28 = ppcVar5;
        anon_unknown_1::ArgConverter<short>::ArgConverter(&local_c0,local_98,(int)*(char *)ppcVar5);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<short>,_void> *)
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      }
      break;
    case (FormatSpec *)0x1e:
      local_28 = ppcVar5;
      anon_unknown_1::ArgConverter<long>::ArgConverter(&local_f0,local_98,(int)*(char *)ppcVar5);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (FormatSpec *)0x20:
      if (*(char *)ppcVar5 == 'l') {
        pcVar1 = (char *)((long)local_28 + 2);
        local_28 = (char **)((long)local_28 + 2);
        anon_unknown_1::ArgConverter<long_long>::ArgConverter(&local_d0,local_98,(int)*pcVar1);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long_long>,_void> *)
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      }
      else {
        local_28 = ppcVar5;
        anon_unknown_1::ArgConverter<long>::ArgConverter(&local_e0,local_98,(int)*(char *)ppcVar5);
        ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      }
      break;
    case (FormatSpec *)0x28:
      local_28 = ppcVar5;
      anon_unknown_1::ArgConverter<long>::ArgConverter(&local_110,local_98,(int)*(char *)ppcVar5);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<long>,_void> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (FormatSpec *)0x2e:
      local_28 = ppcVar5;
      anon_unknown_1::ArgConverter<unsigned_long>::ArgConverter
                (&local_100,local_98,(int)*(char *)ppcVar5);
      ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void>::visit
                ((ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<unsigned_long>,_void> *)
                 in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    }
    if (*(char *)local_28 == '\0') break;
    ppcVar5 = (char **)((long)local_28 + 1);
    local_44.type_ = *(char *)local_28;
    local_28 = ppcVar5;
    if ((int)local_98[0].type < 8) {
      in_stack_fffffffffffffe84 = (wchar_t)local_44.type_;
      if (in_stack_fffffffffffffe84 == L'c') {
        anon_unknown_1::CharConverter::CharConverter
                  ((CharConverter *)&stack0xfffffffffffffec0,local_98);
        ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
                  ((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
                   in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      }
      else if ((in_stack_fffffffffffffe84 == L'i') || (in_stack_fffffffffffffe84 == L'u')) {
        local_44.type_ = 'd';
      }
    }
    local_20 = local_28;
    PrintfArgFormatter<char>::PrintfArgFormatter
              ((PrintfArgFormatter<char> *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               in_stack_fffffffffffffe78,(FormatSpec *)0x225c9e);
    ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void>::visit
              ((ArgVisitor<fmt::internal::PrintfArgFormatter<char>,_void> *)
               in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  }
  uVar4 = __cxa_allocate_exception(0x10);
  BasicCStringRef<char>::BasicCStringRef(&local_128,"invalid format string");
  message.data_._4_4_ = in_stack_fffffffffffffe84;
  message.data_._0_4_ = in_stack_fffffffffffffe80;
  FormatError::FormatError((FormatError *)in_stack_fffffffffffffe78,message);
  __cxa_throw(uVar4,&FormatError::typeinfo,FormatError::~FormatError);
}

Assistant:

void fmt::internal::PrintfFormatter<Char>::format(
    BasicWriter<Char> &writer, BasicCStringRef<Char> format_str) {
  const Char *start = format_str.c_str();
  const Char *s = start;
  while (*s) {
    Char c = *s++;
    if (c != '%') continue;
    if (*s == c) {
      write(writer, start, s);
      start = ++s;
      continue;
    }
    write(writer, start, s - 1);

    FormatSpec spec;
    spec.align_ = ALIGN_RIGHT;

    // Parse argument index, flags and width.
    unsigned arg_index = parse_header(s, spec);

    // Parse precision.
    if (*s == '.') {
      ++s;
      if ('0' <= *s && *s <= '9') {
        spec.precision_ = static_cast<int>(parse_nonnegative_int(s));
      } else if (*s == '*') {
        ++s;
        spec.precision_ = fmt::PrecisionHandler().visit(get_arg(s));
      }
    }

    Arg arg = get_arg(s, arg_index);
    if (spec.flag(HASH_FLAG) && fmt::IsZeroInt().visit(arg))
      spec.flags_ &= ~to_unsigned<int>(HASH_FLAG);
    if (spec.fill_ == '0') {
      if (arg.type <= Arg::LAST_NUMERIC_TYPE)
        spec.align_ = ALIGN_NUMERIC;
      else
        spec.fill_ = ' ';  // Ignore '0' flag for non-numeric types.
    }

    // Parse length and convert the argument to the required type.
    switch (*s++) {
    case 'h':
      if (*s == 'h')
        fmt::ArgConverter<signed char>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<short>(arg, *s).visit(arg);
      break;
    case 'l':
      if (*s == 'l')
        fmt::ArgConverter<fmt::LongLong>(arg, *++s).visit(arg);
      else
        fmt::ArgConverter<long>(arg, *s).visit(arg);
      break;
    case 'j':
      fmt::ArgConverter<intmax_t>(arg, *s).visit(arg);
      break;
    case 'z':
      fmt::ArgConverter<std::size_t>(arg, *s).visit(arg);
      break;
    case 't':
      fmt::ArgConverter<std::ptrdiff_t>(arg, *s).visit(arg);
      break;
    case 'L':
      // printf produces garbage when 'L' is omitted for long double, no
      // need to do the same.
      break;
    default:
      --s;
      fmt::ArgConverter<void>(arg, *s).visit(arg);
    }

    // Parse type.
    if (!*s)
      FMT_THROW(FormatError("invalid format string"));
    spec.type_ = static_cast<char>(*s++);
    if (arg.type <= Arg::LAST_INTEGER_TYPE) {
      // Normalize type.
      switch (spec.type_) {
      case 'i': case 'u':
        spec.type_ = 'd';
        break;
      case 'c':
        // TODO: handle wchar_t
        fmt::CharConverter(arg).visit(arg);
        break;
      }
    }

    start = s;

    // Format argument.
    internal::PrintfArgFormatter<Char>(writer, spec).visit(arg);
  }
  write(writer, start, s);
}